

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.cpp
# Opt level: O0

void LogPlatformUtilsError(string *message)

{
  string *message_00;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_68 [2];
  allocator local_31;
  string local_30;
  string *local_10;
  string *message_local;
  
  local_10 = message;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"platform_utils",&local_31);
  message_00 = local_10;
  local_68[0].super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68[0].super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68[0].super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(local_68);
  LoaderLogger::LogErrorMessage(&local_30,message_00,local_68);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(local_68);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void LogPlatformUtilsError(const std::string& message) { LoaderLogger::LogErrorMessage("platform_utils", message); }